

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecorationVal
          (DecorationManager *this,uint32_t inst_id,uint32_t decoration,uint32_t decoration_value)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  Operand *local_1a0;
  allocator<spvtools::opt::Operand> local_195;
  uint32_t local_194;
  iterator local_190;
  undefined8 local_188;
  SmallVector<unsigned_int,_2UL> local_180;
  uint32_t local_154;
  iterator local_150;
  undefined8 local_148;
  SmallVector<unsigned_int,_2UL> local_140;
  uint32_t local_114;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  Operand OStack_a8;
  Operand OStack_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  uint32_t local_1c;
  uint32_t local_18;
  uint32_t decoration_value_local;
  uint32_t decoration_local;
  uint32_t inst_id_local;
  DecorationManager *this_local;
  
  local_110 = &local_114;
  local_108 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_110;
  local_114 = inst_id;
  local_1c = decoration_value;
  local_18 = decoration;
  decoration_value_local = inst_id;
  _decoration_local = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list_01);
  Operand::Operand(&local_d8,SPV_OPERAND_TYPE_ID,&local_100);
  local_154 = local_18;
  local_150 = &local_154;
  local_148 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_150;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_140,init_list_00);
  Operand::Operand(&OStack_a8,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_140);
  local_194 = local_1c;
  local_190 = &local_194;
  local_188 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_190;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_180,init_list);
  Operand::Operand(&OStack_78,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_180);
  local_48 = &local_d8;
  local_40 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_195);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_38,__l,&local_195);
  AddDecoration(this,OpDecorate,&local_38);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_195);
  local_1a0 = (Operand *)&local_48;
  do {
    local_1a0 = local_1a0 + -1;
    Operand::~Operand(local_1a0);
  } while (local_1a0 != &local_d8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_180);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_140);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  return;
}

Assistant:

void DecorationManager::AddDecorationVal(uint32_t inst_id, uint32_t decoration,
                                         uint32_t decoration_value) {
  AddDecoration(
      spv::Op::OpDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
        {decoration_value}}});
}